

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

unique_ptr<Sock,_std::default_delete<Sock>_> ConnectDirectly(CService *dest,bool manual_connection)

{
  long lVar1;
  socklen_t len_00;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock_00;
  bool bVar2;
  sa_family_t sVar3;
  Logger *this;
  bool in_DL;
  undefined7 in_register_00000031;
  CService *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  socklen_t len;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  string local_d0;
  sockaddr_storage sockaddr;
  
  this_00 = (CService *)CONCAT71(in_register_00000031,manual_connection);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = CService::GetSAFamily(this_00);
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)&sock,
             0x13fe7a0,(uint)sVar3,1);
  if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
      sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
    this = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this,NET,Error);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&sockaddr,this_00);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file._M_len = 0x54;
      logging_function._M_str = "ConnectDirectly";
      logging_function._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x274,NET,Error,
                 "Cannot create a socket for connecting to %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sockaddr);
      if ((char *)sockaddr._0_8_ != sockaddr.__ss_padding + 0xe) goto LAB_00d9c139;
    }
  }
  else {
    len = 0x80;
    bVar2 = CService::GetSockAddr(this_00,(sockaddr *)&sockaddr,&len);
    sock_00 = sock;
    len_00 = len;
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_(&local_d0,this_00);
      bVar2 = ConnectToSocket((Sock *)sock_00._M_t.
                                      super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                                      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                                      super__Head_base<0UL,_Sock_*,_false>._M_head_impl,
                              (sockaddr *)&sockaddr,len_00,&local_d0,in_DL);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        (ulong)(local_d0.field_2._M_allocated_capacity + 1));
      }
      if (bVar2) {
        (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect =
             (char *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                     super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                     super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
        sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
        goto LAB_00d9c148;
      }
    }
    else {
      CService::ToStringAddrPort_abi_cxx11_(&local_d0,this_00);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file_00._M_len = 0x54;
      logging_function_00._M_str = "ConnectDirectly";
      logging_function_00._M_len = 0xf;
      LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_00,0x27c,ALL,Info,
                 "Cannot get sockaddr for %s: unsupported network\n",&local_d0);
      sockaddr.__ss_padding._14_8_ = local_d0.field_2._M_allocated_capacity;
      sockaddr._0_8_ = local_d0._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_00d9c139:
        operator_delete((void *)sockaddr._0_8_,(ulong)(sockaddr.__ss_padding._14_8_ + 1));
      }
    }
  }
  (dest->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
LAB_00d9c148:
  if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
      sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
    (**(code **)(*(long *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                          super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)dest;
}

Assistant:

std::unique_ptr<Sock> ConnectDirectly(const CService& dest, bool manual_connection)
{
    auto sock = CreateSock(dest.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", dest.ToStringAddrPort());
        return {};
    }

    // Create a sockaddr from the specified service.
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!dest.GetSockAddr((struct sockaddr*)&sockaddr, &len)) {
        LogPrintf("Cannot get sockaddr for %s: unsupported network\n", dest.ToStringAddrPort());
        return {};
    }

    if (!ConnectToSocket(*sock, (struct sockaddr*)&sockaddr, len, dest.ToStringAddrPort(), manual_connection)) {
        return {};
    }

    return sock;
}